

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool cmSetPropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  cVar5;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  byte local_361;
  undefined1 local_2b8 [6];
  bool source_file_paths_should_be_absolute;
  bool file_scopes_handled;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> source_file_directory_makefiles;
  string local_298;
  undefined4 local_274;
  cmAlphaNum local_270;
  cmAlphaNum local_240;
  string local_210;
  _Base_ptr local_1f0;
  undefined1 local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  string *arg;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin1;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1b8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_1a8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  char *sep;
  Doing doing;
  bool source_file_target_option_enabled;
  bool source_file_directory_option_enabled;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_target_directories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_directories;
  string propertyValue;
  string propertyName;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined1 local_e8 [5];
  bool remove;
  bool appendMode;
  bool appendAsString;
  cmAlphaNum local_b8;
  string local_88;
  int local_64;
  const_reference pvStack_60;
  ScopeType scope;
  string *scopeName;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar1 = local_20;
  if (sVar3 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    pvStack_60 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local);
    bVar2 = std::operator==(pvStack_60,"GLOBAL");
    if (bVar2) {
      local_64 = 3;
    }
    else {
      bVar2 = std::operator==(pvStack_60,"DIRECTORY");
      if (bVar2) {
        local_64 = 2;
      }
      else {
        bVar2 = std::operator==(pvStack_60,"TARGET");
        if (bVar2) {
          local_64 = 0;
        }
        else {
          bVar2 = std::operator==(pvStack_60,"SOURCE");
          if (bVar2) {
            local_64 = 1;
          }
          else {
            bVar2 = std::operator==(pvStack_60,"TEST");
            if (bVar2) {
              local_64 = 5;
            }
            else {
              bVar2 = std::operator==(pvStack_60,"CACHE");
              if (bVar2) {
                local_64 = 4;
              }
              else {
                bVar2 = std::operator==(pvStack_60,"INSTALL");
                pcVar1 = local_20;
                if (!bVar2) {
                  cmAlphaNum::cmAlphaNum(&local_b8,"given invalid scope ");
                  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_e8,pvStack_60);
                  cmStrCat<char[77]>(&local_88,&local_b8,(cmAlphaNum *)local_e8,
                                     (char (*) [77])
                                     ".  Valid scopes are GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, CACHE, INSTALL."
                                    );
                  cmExecutionStatus::SetError(pcVar1,&local_88);
                  std::__cxx11::string::~string((string *)&local_88);
                  args_local._7_1_ = 0;
                  goto LAB_003542c7;
                }
                local_64 = 8;
              }
            }
          }
        }
      }
    }
    names._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = false;
    names._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = false;
    names._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = true;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&propertyName.field_2 + 8));
    std::__cxx11::string::string((string *)(propertyValue.field_2._M_local_buf + 8));
    std::__cxx11::string::string
              ((string *)
               &source_file_directories.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&source_file_target_directories.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&doing);
    sep._7_1_ = 0;
    sep._6_1_ = 0;
    sep._0_4_ = 1;
    __range1 = (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)0xc35687;
    cVar5 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local);
    __begin1 = cVar5.Begin._M_current;
    local_1b8 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&__begin1,1);
    local_1a8 = &local_1b8;
    __end1 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::begin(local_1a8);
    arg = (string *)
          cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::end(local_1a8);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&arg);
      if (!bVar2) break;
      local_1e0 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
      bVar2 = std::operator==(local_1e0,"PROPERTY");
      if (bVar2) {
        sep._0_4_ = 2;
      }
      else {
        bVar2 = std::operator==(local_1e0,"APPEND");
        if (bVar2) {
          sep._0_4_ = 0;
          names._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = true;
          names._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = false;
          names._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = false;
        }
        else {
          bVar2 = std::operator==(local_1e0,"APPEND_STRING");
          if (bVar2) {
            sep._0_4_ = 0;
            names._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = true;
            names._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = false;
            names._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = true;
          }
          else {
            if ((((int)sep != 2) && ((int)sep != 3)) && (local_64 == 1)) {
              bVar2 = std::operator==(local_1e0,"DIRECTORY");
              if (bVar2) {
                sep._0_4_ = 4;
                sep._7_1_ = 1;
                goto LAB_00353d89;
              }
            }
            if ((((int)sep != 2) && ((int)sep != 3)) && (local_64 == 1)) {
              bVar2 = std::operator==(local_1e0,"TARGET_DIRECTORY");
              if (bVar2) {
                sep._0_4_ = 5;
                sep._6_1_ = 1;
                goto LAB_00353d89;
              }
            }
            pcVar1 = local_20;
            if ((int)sep == 1) {
              pVar6 = std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)((long)&propertyName.field_2 + 8),local_1e0);
              local_1f0 = (_Base_ptr)pVar6.first._M_node;
              local_1e8 = pVar6.second;
            }
            else if ((int)sep == 4) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&source_file_target_directories.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_1e0);
            }
            else if ((int)sep == 5) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&doing,local_1e0);
            }
            else if ((int)sep == 2) {
              std::__cxx11::string::operator=
                        ((string *)(propertyValue.field_2._M_local_buf + 8),(string *)local_1e0);
              sep._0_4_ = 3;
            }
            else {
              if ((int)sep != 3) {
                cmAlphaNum::cmAlphaNum(&local_240,"given invalid argument \"");
                cmAlphaNum::cmAlphaNum(&local_270,local_1e0);
                cmStrCat<char[3]>(&local_210,&local_240,&local_270,(char (*) [3])0xbfb275);
                cmExecutionStatus::SetError(pcVar1,&local_210);
                std::__cxx11::string::~string((string *)&local_210);
                args_local._7_1_ = 0;
                local_274 = 1;
                goto LAB_0035424b;
              }
              std::__cxx11::string::operator+=
                        ((string *)
                         &source_file_directories.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(char *)__range1);
              __range1 = (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)0xc08922;
              std::__cxx11::string::operator+=
                        ((string *)
                         &source_file_directories.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_1e0);
              names._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = false;
            }
          }
        }
      }
LAB_00353d89:
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    uVar4 = std::__cxx11::string::empty();
    pcVar1 = local_20;
    if ((uVar4 & 1) == 0) {
      std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
                ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_2b8);
      bVar2 = SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes
                        (local_20,(bool)(sep._7_1_ & 1),(bool)(sep._6_1_ & 1),
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&source_file_target_directories.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&doing,(vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_2b8)
      ;
      if (bVar2) {
        local_361 = 1;
        if ((sep._7_1_ & 1) == 0) {
          local_361 = sep._6_1_;
        }
        switch(local_64) {
        case 0:
          args_local._7_1_ =
               anon_unknown.dwarf_56a282::HandleTargetMode
                         (local_20,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&propertyName.field_2 + 8),
                          (string *)((long)&propertyValue.field_2 + 8),
                          (string *)
                          &source_file_directories.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_);
          break;
        case 1:
          args_local._7_1_ =
               anon_unknown.dwarf_56a282::HandleSourceMode
                         (local_20,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&propertyName.field_2 + 8),
                          (string *)((long)&propertyValue.field_2 + 8),
                          (string *)
                          &source_file_directories.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_,
                          (vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_2b8,
                          (bool)(local_361 & 1));
          break;
        case 2:
          args_local._7_1_ =
               anon_unknown.dwarf_56a282::HandleDirectoryMode
                         (local_20,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&propertyName.field_2 + 8),
                          (string *)((long)&propertyValue.field_2 + 8),
                          (string *)
                          &source_file_directories.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_);
          break;
        case 3:
          args_local._7_1_ =
               anon_unknown.dwarf_56a282::HandleGlobalMode
                         (local_20,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&propertyName.field_2 + 8),
                          (string *)((long)&propertyValue.field_2 + 8),
                          (string *)
                          &source_file_directories.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_);
          break;
        case 4:
          args_local._7_1_ =
               anon_unknown.dwarf_56a282::HandleCacheMode
                         (local_20,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&propertyName.field_2 + 8),
                          (string *)((long)&propertyValue.field_2 + 8),
                          (string *)
                          &source_file_directories.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_);
          break;
        case 5:
          args_local._7_1_ =
               anon_unknown.dwarf_56a282::HandleTestMode
                         (local_20,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&propertyName.field_2 + 8),
                          (string *)((long)&propertyValue.field_2 + 8),
                          (string *)
                          &source_file_directories.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_);
          break;
        case 6:
        case 7:
        default:
          args_local._7_1_ = true;
          break;
        case 8:
          args_local._7_1_ =
               anon_unknown.dwarf_56a282::HandleInstallMode
                         (local_20,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&propertyName.field_2 + 8),
                          (string *)((long)&propertyValue.field_2 + 8),
                          (string *)
                          &source_file_directories.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_,
                          names._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_);
        }
      }
      else {
        args_local._7_1_ = false;
      }
      local_274 = 1;
      std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~vector
                ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_2b8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,"not given a PROPERTY <name> argument.",
                 (allocator<char> *)
                 ((long)&source_file_directory_makefiles.
                         super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      cmExecutionStatus::SetError(pcVar1,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&source_file_directory_makefiles.
                         super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      args_local._7_1_ = 0;
      local_274 = 1;
    }
LAB_0035424b:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&doing);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&source_file_target_directories.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &source_file_directories.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)(propertyValue.field_2._M_local_buf + 8));
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&propertyName.field_2 + 8));
  }
LAB_003542c7:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmSetPropertyCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // Get the scope on which to set the property.
  std::string const& scopeName = args.front();
  cmProperty::ScopeType scope;
  if (scopeName == "GLOBAL") {
    scope = cmProperty::GLOBAL;
  } else if (scopeName == "DIRECTORY") {
    scope = cmProperty::DIRECTORY;
  } else if (scopeName == "TARGET") {
    scope = cmProperty::TARGET;
  } else if (scopeName == "SOURCE") {
    scope = cmProperty::SOURCE_FILE;
  } else if (scopeName == "TEST") {
    scope = cmProperty::TEST;
  } else if (scopeName == "CACHE") {
    scope = cmProperty::CACHE;
  } else if (scopeName == "INSTALL") {
    scope = cmProperty::INSTALL;
  } else {
    status.SetError(cmStrCat("given invalid scope ", scopeName,
                             ".  "
                             "Valid scopes are GLOBAL, DIRECTORY, "
                             "TARGET, SOURCE, TEST, CACHE, INSTALL."));
    return false;
  }

  bool appendAsString = false;
  bool appendMode = false;
  bool remove = true;
  std::set<std::string> names;
  std::string propertyName;
  std::string propertyValue;

  std::vector<std::string> source_file_directories;
  std::vector<std::string> source_file_target_directories;
  bool source_file_directory_option_enabled = false;
  bool source_file_target_option_enabled = false;

  // Parse the rest of the arguments up to the values.
  enum Doing
  {
    DoingNone,
    DoingNames,
    DoingProperty,
    DoingValues,
    DoingSourceDirectory,
    DoingSourceTargetDirectory
  };
  Doing doing = DoingNames;
  const char* sep = "";
  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    if (arg == "PROPERTY") {
      doing = DoingProperty;
    } else if (arg == "APPEND") {
      doing = DoingNone;
      appendMode = true;
      remove = false;
      appendAsString = false;
    } else if (arg == "APPEND_STRING") {
      doing = DoingNone;
      appendMode = true;
      remove = false;
      appendAsString = true;
    } else if (doing != DoingProperty && doing != DoingValues &&
               scope == cmProperty::SOURCE_FILE && arg == "DIRECTORY") {
      doing = DoingSourceDirectory;
      source_file_directory_option_enabled = true;
    } else if (doing != DoingProperty && doing != DoingValues &&
               scope == cmProperty::SOURCE_FILE && arg == "TARGET_DIRECTORY") {
      doing = DoingSourceTargetDirectory;
      source_file_target_option_enabled = true;
    } else if (doing == DoingNames) {
      names.insert(arg);
    } else if (doing == DoingSourceDirectory) {
      source_file_directories.push_back(arg);
    } else if (doing == DoingSourceTargetDirectory) {
      source_file_target_directories.push_back(arg);
    } else if (doing == DoingProperty) {
      propertyName = arg;
      doing = DoingValues;
    } else if (doing == DoingValues) {
      propertyValue += sep;
      sep = ";";
      propertyValue += arg;
      remove = false;
    } else {
      status.SetError(cmStrCat("given invalid argument \"", arg, "\"."));
      return false;
    }
  }

  // Make sure a property name was found.
  if (propertyName.empty()) {
    status.SetError("not given a PROPERTY <name> argument.");
    return false;
  }

  std::vector<cmMakefile*> source_file_directory_makefiles;
  bool file_scopes_handled =
    SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes(
      status, source_file_directory_option_enabled,
      source_file_target_option_enabled, source_file_directories,
      source_file_target_directories, source_file_directory_makefiles);
  if (!file_scopes_handled) {
    return false;
  }
  bool source_file_paths_should_be_absolute =
    source_file_directory_option_enabled || source_file_target_option_enabled;

  // Dispatch property setting.
  switch (scope) {
    case cmProperty::GLOBAL:
      return HandleGlobalMode(status, names, propertyName, propertyValue,
                              appendAsString, appendMode, remove);
    case cmProperty::DIRECTORY:
      return HandleDirectoryMode(status, names, propertyName, propertyValue,
                                 appendAsString, appendMode, remove);
    case cmProperty::TARGET:
      return HandleTargetMode(status, names, propertyName, propertyValue,
                              appendAsString, appendMode, remove);
    case cmProperty::SOURCE_FILE:
      return HandleSourceMode(status, names, propertyName, propertyValue,
                              appendAsString, appendMode, remove,
                              source_file_directory_makefiles,
                              source_file_paths_should_be_absolute);
    case cmProperty::TEST:
      return HandleTestMode(status, names, propertyName, propertyValue,
                            appendAsString, appendMode, remove);
    case cmProperty::CACHE:
      return HandleCacheMode(status, names, propertyName, propertyValue,
                             appendAsString, appendMode, remove);
    case cmProperty::INSTALL:
      return HandleInstallMode(status, names, propertyName, propertyValue,
                               appendAsString, appendMode, remove);

    case cmProperty::VARIABLE:
    case cmProperty::CACHED_VARIABLE:
      break; // should never happen
  }
  return true;
}